

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O1

void ON_BrepTransformSwapSrfHelper(ON_Brep *brep,ON_NurbsSurface *nurbs_srf,int si)

{
  ON_Object *source_object;
  bool bVar1;
  ON_Object *pOVar2;
  ON_BrepFace *this;
  long lVar3;
  ON_UserDataHolder udholder;
  ON_Object local_40;
  
  source_object = (ON_Object *)(brep->m_S).super_ON_SimpleArray<ON_Surface_*>.m_a[si];
  ON_Object::ON_Object(&local_40);
  local_40._vptr_ON_Object = (_func_int **)&PTR_ClassId_0082b2d8;
  ON_UserDataHolder::MoveUserDataFrom((ON_UserDataHolder *)&local_40,source_object);
  ON_UserDataHolder::MoveUserDataTo((ON_UserDataHolder *)&local_40,(ON_Object *)nurbs_srf,false);
  (brep->m_S).super_ON_SimpleArray<ON_Surface_*>.m_a[si] = &nurbs_srf->super_ON_Surface;
  lVar3 = (long)(brep->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.
                m_count;
  if (0 < lVar3) {
    this = (brep->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.m_a;
    do {
      if (this->m_si == si) {
LAB_003ed23d:
        bVar1 = ON_SurfaceProxy::ProxySurfaceIsTransposed(&this->super_ON_SurfaceProxy);
        ON_SurfaceProxy::SetProxySurface(&this->super_ON_SurfaceProxy,&nurbs_srf->super_ON_Surface);
        if (bVar1) {
          ON_SurfaceProxy::Transpose(&this->super_ON_SurfaceProxy);
        }
      }
      else {
        pOVar2 = (ON_Object *)ON_SurfaceProxy::ProxySurface(&this->super_ON_SurfaceProxy);
        if (pOVar2 == source_object) goto LAB_003ed23d;
      }
      this = this + 1;
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
  }
  (*source_object->_vptr_ON_Object[4])(source_object);
  ON_Object::~ON_Object(&local_40);
  return;
}

Assistant:

static void ON_BrepTransformSwapSrfHelper( ON_Brep& brep, ON_NurbsSurface* nurbs_srf, int si )
{
  // Replace plane surface which could not be properly transformed
  // with nurbs_surface.
  ON_Surface* old_srf = brep.m_S[si];
  ON_UserDataHolder udholder;
  udholder.MoveUserDataFrom(*old_srf);
  udholder.MoveUserDataTo(*nurbs_srf,false);
  brep.m_S[si] = nurbs_srf;
  
  // Update faces to use new surface.
  const int fcount = brep.m_F.Count();
  ON_BrepFace* f = brep.m_F.Array();
  for ( int fi = 0; fi < fcount; fi++ )
  {
    if (f[fi].m_si == si || f[fi].ProxySurface() == old_srf )
    {
      const bool bIsTransposed = f[fi].ProxySurfaceIsTransposed();
      f[fi].SetProxySurface(nurbs_srf);
      if (bIsTransposed)
        f[fi].ON_SurfaceProxy::Transpose();
    }
  }

  delete old_srf;
}